

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O3

void sysbvm_boolean_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction(sysbvm_boolean_primitive_not,"Boolean::not");
  sysbvm_primitiveTable_registerFunction(sysbvm_boolean_primitive_xor,"Boolean::|");
  sysbvm_primitiveTable_registerFunction(sysbvm_boolean_primitive_asUInt8,"Boolean::asUInt8");
  sysbvm_primitiveTable_registerFunction(sysbvm_boolean_primitive_asInt8,"Boolean::asInt8");
  sysbvm_primitiveTable_registerFunction(sysbvm_boolean16_primitive_asUInt16,"Boolean::asUInt16");
  sysbvm_primitiveTable_registerFunction(sysbvm_boolean16_primitive_asInt16,"Boolean::asInt16");
  sysbvm_primitiveTable_registerFunction(sysbvm_boolean32_primitive_asUInt32,"Boolean::asUInt32");
  sysbvm_primitiveTable_registerFunction(sysbvm_boolean32_primitive_asInt32,"Boolean::asInt32");
  sysbvm_primitiveTable_registerFunction(sysbvm_boolean64_primitive_asUInt64,"Boolean::asUInt64");
  sysbvm_primitiveTable_registerFunction(sysbvm_boolean64_primitive_asInt64,"Boolean::asInt64");
  return;
}

Assistant:

void sysbvm_boolean_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_boolean_primitive_not, "Boolean::not");
    sysbvm_primitiveTable_registerFunction(sysbvm_boolean_primitive_xor, "Boolean::|");

    sysbvm_primitiveTable_registerFunction(sysbvm_boolean_primitive_asUInt8,    "Boolean::asUInt8");
    sysbvm_primitiveTable_registerFunction(sysbvm_boolean_primitive_asInt8,     "Boolean::asInt8");
    sysbvm_primitiveTable_registerFunction(sysbvm_boolean16_primitive_asUInt16, "Boolean::asUInt16");
    sysbvm_primitiveTable_registerFunction(sysbvm_boolean16_primitive_asInt16,  "Boolean::asInt16");
    sysbvm_primitiveTable_registerFunction(sysbvm_boolean32_primitive_asUInt32, "Boolean::asUInt32");
    sysbvm_primitiveTable_registerFunction(sysbvm_boolean32_primitive_asInt32,  "Boolean::asInt32");
    sysbvm_primitiveTable_registerFunction(sysbvm_boolean64_primitive_asUInt64, "Boolean::asUInt64");
    sysbvm_primitiveTable_registerFunction(sysbvm_boolean64_primitive_asInt64,  "Boolean::asInt64");
}